

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse2_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  uint uVar2;
  ushort *puVar3;
  short *psVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  int *piVar8;
  ulong uVar9;
  short sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int16_t iVar13;
  int16_t iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  parasail_result_t *ppVar19;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *palVar20;
  undefined2 uVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  ulong size;
  long lVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  int32_t segNum;
  long lVar31;
  uint uVar32;
  uint uVar33;
  ushort uVar34;
  undefined4 uVar36;
  ushort uVar48;
  ushort uVar50;
  ulong uVar38;
  ushort uVar49;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  undefined1 auVar39 [16];
  undefined4 uVar37;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ushort uVar54;
  short sVar56;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  __m128i alVar57;
  short sVar66;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar67 [16];
  ushort uVar68;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  short sVar82;
  short sVar89;
  short sVar90;
  short sVar91;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  ushort uVar92;
  int iVar93;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  int iVar102;
  ushort uVar103;
  ushort uVar104;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  ushort uVar105;
  int iVar106;
  int iVar110;
  int iVar111;
  undefined1 auVar107 [16];
  int iVar112;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  int local_198;
  int local_138;
  short local_88;
  short sStack_86;
  ushort local_78;
  ushort uStack_76;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar35;
  short sVar55;
  short sVar69;
  undefined1 auVar86 [16];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_scan_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar6 = (profile->profile16).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sg_flags_table_scan_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_scan_profile_sse2_128_16_cold_6();
      }
      else {
        uVar5 = profile->s1Len;
        if ((int)uVar5 < 1) {
          parasail_sg_flags_table_scan_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_scan_profile_sse2_128_16_cold_4();
        }
        else {
          uVar25 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_table_scan_profile_sse2_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_table_scan_profile_sse2_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_table_scan_profile_sse2_128_16_cold_1();
          }
          else {
            uVar15 = uVar5 - 1;
            uVar38 = (ulong)uVar5 + 7;
            size = uVar38 >> 3;
            uVar9 = (ulong)uVar15 % size;
            iVar16 = (int)(uVar15 / size);
            uVar32 = -open;
            uVar18 = ppVar7->min;
            iVar27 = -uVar18;
            if (uVar18 != uVar32 && SBORROW4(uVar18,uVar32) == (int)(uVar18 + open) < 0) {
              iVar27 = open;
            }
            iVar28 = ppVar7->max;
            ppVar19 = parasail_result_new_table1((uint)uVar38 & 0x7ffffff8,s2Len);
            if (ppVar19 != (parasail_result_t *)0x0) {
              iVar22 = (uint)(s1_end != 0) * 0x10;
              ppVar19->flag =
                   iVar22 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                   (uint)(s2_end != 0) << 0xf | ppVar19->flag | 0x8220402;
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              auVar39._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
              auVar39._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
              auVar39._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
              auVar39._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
              iVar22 = movmskps(iVar22,auVar39);
              if (iVar22 != 0) {
                return (parasail_result_t *)0x0;
              }
              if (ptr_03 == (__m128i *)0x0) {
                return (parasail_result_t *)0x0;
              }
              iVar22 = s2Len + -1;
              uVar23 = 7 - iVar16;
              auVar39 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar36 = auVar39._0_4_;
              auVar67._4_4_ = uVar36;
              auVar67._0_4_ = uVar36;
              auVar67._8_4_ = uVar36;
              auVar67._12_4_ = uVar36;
              auVar39 = pshuflw(auVar39,ZEXT416((uint)gap),0);
              uVar36 = auVar39._0_4_;
              uVar17 = iVar27 - 0x7fff;
              auVar39 = pshuflw(ZEXT416(uVar17),ZEXT416(uVar17),0);
              uVar37 = auVar39._0_4_;
              auVar40 = ZEXT416(CONCAT22((short)(uVar18 >> 0x10),0x7ffe - (short)iVar28));
              auVar40 = pshuflw(auVar40,auVar40,0);
              auVar41 = pshuflw(ZEXT416(uVar23),ZEXT416(uVar23),0);
              uVar18 = (uint)size;
              auVar42 = pshuflw(ZEXT416(-(uVar18 * gap)),ZEXT416(-(uVar18 * gap)),0);
              uVar33 = auVar42._0_4_;
              auVar42._0_8_ = CONCAT44(uVar33,uVar33);
              auVar42._8_4_ = uVar33;
              auVar42._12_4_ = uVar33;
              auVar77._0_8_ = auVar42._0_8_ << 0x10;
              auVar77._8_8_ = auVar42._8_8_ << 0x10 | (ulong)(uVar33 >> 0x10);
              auVar42 = paddsw(auVar77,ZEXT416(uVar17 & 0xffff));
              lVar24 = (long)(int)uVar32;
              uVar29 = 0;
              do {
                lVar31 = 0;
                lVar30 = lVar24;
                do {
                  lVar26 = lVar30;
                  if (s1_beg != 0) {
                    lVar26 = 0;
                  }
                  uVar21 = 0x8000;
                  if (-0x8000 < lVar26) {
                    uVar21 = (undefined2)lVar26;
                  }
                  *(undefined2 *)((long)&local_48 + lVar31 * 2) = uVar21;
                  lVar26 = lVar26 - (ulong)(uint)open;
                  if (lVar26 < -0x7fff) {
                    lVar26 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar31 * 2) = (short)lVar26;
                  lVar31 = lVar31 + 1;
                  lVar30 = lVar30 - size * (uint)gap;
                } while (lVar31 != 8);
                ptr_02[uVar29][0] = local_48;
                ptr_02[uVar29][1] = lStack_40;
                ptr[uVar29][0] = local_58;
                ptr[uVar29][1] = lStack_50;
                uVar29 = uVar29 + 1;
                lVar24 = lVar24 - (ulong)(uint)gap;
              } while (uVar29 != size);
              *ptr_00 = 0;
              auVar58 = _DAT_00904aa0;
              auVar77 = _DAT_00903aa0;
              lVar24 = uVar25 - 1;
              auVar107._8_4_ = (int)lVar24;
              auVar107._0_8_ = lVar24;
              auVar107._12_4_ = (int)((ulong)lVar24 >> 0x20);
              iVar28 = -gap;
              iVar27 = gap * 2;
              auVar107 = auVar107 ^ _DAT_00903aa0;
              auVar74._8_4_ = 0xffffffff;
              auVar74._0_8_ = 0xffffffffffffffff;
              auVar74._12_4_ = 0xffffffff;
              uVar29 = 0;
              uVar33 = uVar32;
              do {
                auVar45._0_4_ = (undefined4)uVar29;
                auVar118._8_4_ = auVar45._0_4_;
                auVar118._0_8_ = uVar29;
                auVar118._12_4_ = (int)(uVar29 >> 0x20);
                auVar43 = (auVar118 | _DAT_00903a90) ^ auVar77;
                iVar106 = auVar107._0_4_;
                iVar93 = -(uint)(iVar106 < auVar43._0_4_);
                iVar110 = auVar107._4_4_;
                auVar124._4_4_ = -(uint)(iVar110 < auVar43._4_4_);
                iVar111 = auVar107._8_4_;
                iVar102 = -(uint)(iVar111 < auVar43._8_4_);
                iVar112 = auVar107._12_4_;
                auVar124._12_4_ = -(uint)(iVar112 < auVar43._12_4_);
                auVar70._4_4_ = iVar93;
                auVar70._0_4_ = iVar93;
                auVar70._8_4_ = iVar102;
                auVar70._12_4_ = iVar102;
                auVar120 = pshuflw(in_XMM14,auVar70,0xe8);
                auVar121._0_4_ = -(uint)(auVar43._0_4_ == iVar106);
                auVar121._4_4_ = -(uint)(auVar43._4_4_ == iVar110);
                auVar121._8_4_ = -(uint)(auVar43._8_4_ == iVar111);
                auVar121._12_4_ = -(uint)(auVar43._12_4_ == iVar112);
                auVar123._4_4_ = auVar121._4_4_;
                auVar123._0_4_ = auVar121._4_4_;
                auVar123._8_4_ = auVar121._12_4_;
                auVar123._12_4_ = auVar121._12_4_;
                auVar116 = pshuflw(in_XMM10,auVar123,0xe8);
                auVar124._0_4_ = auVar124._4_4_;
                auVar124._8_4_ = auVar124._12_4_;
                auVar43 = pshuflw(auVar121,auVar124,0xe8);
                auVar43 = (auVar43 | auVar116 & auVar120) ^ auVar74;
                auVar43 = packssdw(auVar43,auVar43);
                uVar2 = gap * -3 + uVar33;
                auVar120._0_4_ = -(uint)(auVar58._0_4_ < (int)uVar33);
                auVar120._4_4_ = -(uint)(auVar58._4_4_ < iVar28 - open);
                auVar120._8_4_ = -(uint)(auVar58._8_4_ < (int)(uVar32 - iVar27));
                auVar120._12_4_ = -(uint)(auVar58._12_4_ < (int)uVar2);
                auVar116._0_4_ = uVar33 & auVar120._0_4_;
                auVar116._4_4_ = iVar28 - open & auVar120._4_4_;
                auVar116._8_4_ = uVar32 - iVar27 & auVar120._8_4_;
                auVar116._12_4_ = uVar2 & auVar120._12_4_;
                auVar121 = ~auVar120 & auVar58 | auVar116;
                iVar13 = 0;
                if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  iVar14 = auVar121._0_2_;
                  if (s2_beg != 0) {
                    iVar14 = iVar13;
                  }
                  ptr_00[uVar29 + 1] = iVar14;
                }
                auVar124 = auVar123 & auVar70 | auVar124;
                auVar43 = packssdw(auVar124,auVar124);
                auVar43 = packssdw(auVar43 ^ auVar74,auVar43 ^ auVar74);
                if ((auVar43._0_4_ >> 0x10 & 1) != 0) {
                  iVar14 = auVar121._4_2_;
                  if (s2_beg != 0) {
                    iVar14 = iVar13;
                  }
                  ptr_00[uVar29 + 2] = iVar14;
                }
                auVar70 = (auVar118 | _DAT_00903a80) ^ auVar77;
                iVar93 = -(uint)(iVar106 < auVar70._0_4_);
                auVar94._4_4_ = -(uint)(iVar110 < auVar70._4_4_);
                iVar102 = -(uint)(iVar111 < auVar70._8_4_);
                auVar94._12_4_ = -(uint)(iVar112 < auVar70._12_4_);
                auVar44._4_4_ = iVar93;
                auVar44._0_4_ = iVar93;
                auVar44._8_4_ = iVar102;
                auVar44._12_4_ = iVar102;
                auVar71._4_4_ = -(uint)(auVar70._4_4_ == iVar110);
                auVar71._12_4_ = -(uint)(auVar70._12_4_ == iVar112);
                auVar71._0_4_ = auVar71._4_4_;
                auVar71._8_4_ = auVar71._12_4_;
                auVar94._0_4_ = auVar94._4_4_;
                auVar94._8_4_ = auVar94._12_4_;
                auVar70 = auVar71 & auVar44 | auVar94;
                auVar70 = packssdw(auVar70,auVar70);
                auVar70 = packssdw(auVar70 ^ auVar74,auVar70 ^ auVar74);
                if ((auVar70 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  iVar14 = auVar121._8_2_;
                  if (s2_beg != 0) {
                    iVar14 = iVar13;
                  }
                  ptr_00[uVar29 + 3] = iVar14;
                }
                auVar70 = pshufhw(auVar44,auVar44,0x84);
                auVar120 = pshufhw(auVar71,auVar71,0x84);
                auVar124 = pshufhw(auVar70,auVar94,0x84);
                auVar70 = (auVar124 | auVar120 & auVar70) ^ auVar74;
                auVar70 = packssdw(auVar70,auVar70);
                if ((auVar70 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  iVar14 = auVar121._12_2_;
                  if (s2_beg != 0) {
                    iVar14 = iVar13;
                  }
                  ptr_00[uVar29 + 4] = iVar14;
                }
                auVar45._4_4_ = auVar45._0_4_;
                auVar45._8_4_ = auVar45._0_4_;
                auVar45._12_4_ = auVar45._0_4_;
                auVar45 = auVar45 | _DAT_00904a90;
                auVar113._4_4_ = gap;
                auVar113._0_4_ = gap;
                auVar113._8_4_ = gap;
                auVar113._12_4_ = gap;
                auVar95._0_4_ = uVar32 - auVar45._0_4_ * gap;
                auVar95._4_4_ = uVar32 - gap * auVar45._4_4_;
                auVar95._8_4_ = uVar32 - (int)((auVar45._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                auVar95._12_4_ =
                     uVar32 - (int)((auVar113._8_8_ & 0xffffffff) * (ulong)auVar45._12_4_);
                auVar122._0_4_ = -(uint)(auVar58._0_4_ < auVar95._0_4_);
                auVar122._4_4_ = -(uint)(auVar58._4_4_ < auVar95._4_4_);
                auVar122._8_4_ = -(uint)(auVar58._8_4_ < auVar95._8_4_);
                auVar122._12_4_ = -(uint)(auVar58._12_4_ < auVar95._12_4_);
                in_XMM14 = ~auVar122 & auVar58 | auVar95 & auVar122;
                auVar121 = (auVar118 | _DAT_00903ad0) ^ auVar77;
                auVar114._0_4_ = -(uint)(iVar106 < auVar121._0_4_);
                auVar114._4_4_ = -(uint)(iVar110 < auVar121._4_4_);
                auVar114._8_4_ = -(uint)(iVar111 < auVar121._8_4_);
                auVar114._12_4_ = -(uint)(iVar112 < auVar121._12_4_);
                auVar96._4_4_ = auVar114._0_4_;
                auVar96._0_4_ = auVar114._0_4_;
                auVar96._8_4_ = auVar114._8_4_;
                auVar96._12_4_ = auVar114._8_4_;
                in_XMM10 = pshuflw(auVar116,auVar96,0xe8);
                iVar93 = -(uint)(auVar121._4_4_ == iVar110);
                iVar102 = -(uint)(auVar121._12_4_ == iVar112);
                auVar46._4_4_ = iVar93;
                auVar46._0_4_ = iVar93;
                auVar46._8_4_ = iVar102;
                auVar46._12_4_ = iVar102;
                auVar45 = pshuflw(auVar43,auVar46,0xe8);
                auVar43._4_4_ = auVar114._4_4_;
                auVar43._0_4_ = auVar114._4_4_;
                auVar43._8_4_ = auVar114._12_4_;
                auVar43._12_4_ = auVar114._12_4_;
                auVar121 = pshuflw(auVar114,auVar43,0xe8);
                auVar121 = (auVar121 | auVar45 & in_XMM10) ^ auVar74;
                auVar121 = packssdw(auVar121,auVar121);
                if ((auVar121 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  iVar14 = in_XMM14._0_2_;
                  if (s2_beg != 0) {
                    iVar14 = iVar13;
                  }
                  ptr_00[uVar29 + 5] = iVar14;
                }
                auVar43 = auVar46 & auVar96 | auVar43;
                auVar43 = packssdw(auVar43,auVar43);
                auVar43 = packssdw(auVar43 ^ auVar74,auVar43 ^ auVar74);
                if ((auVar43 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  iVar14 = in_XMM14._4_2_;
                  if (s2_beg != 0) {
                    iVar14 = iVar13;
                  }
                  ptr_00[uVar29 + 6] = iVar14;
                }
                auVar43 = (auVar118 | _DAT_00903ac0) ^ auVar77;
                iVar93 = -(uint)(iVar106 < auVar43._0_4_);
                auVar97._4_4_ = -(uint)(iVar110 < auVar43._4_4_);
                iVar102 = -(uint)(iVar111 < auVar43._8_4_);
                auVar97._12_4_ = -(uint)(iVar112 < auVar43._12_4_);
                auVar47._4_4_ = iVar93;
                auVar47._0_4_ = iVar93;
                auVar47._8_4_ = iVar102;
                auVar47._12_4_ = iVar102;
                iVar93 = -(uint)(auVar43._4_4_ == iVar110);
                iVar102 = -(uint)(auVar43._12_4_ == iVar112);
                auVar72._4_4_ = iVar93;
                auVar72._0_4_ = iVar93;
                auVar72._8_4_ = iVar102;
                auVar72._12_4_ = iVar102;
                auVar97._0_4_ = auVar97._4_4_;
                auVar97._8_4_ = auVar97._12_4_;
                auVar43 = auVar72 & auVar47 | auVar97;
                auVar43 = packssdw(auVar43,auVar43);
                auVar43 = packssdw(auVar43 ^ auVar74,auVar43 ^ auVar74);
                if ((auVar43 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  iVar14 = in_XMM14._8_2_;
                  if (s2_beg != 0) {
                    iVar14 = iVar13;
                  }
                  ptr_00[uVar29 + 7] = iVar14;
                }
                auVar43 = pshufhw(auVar47,auVar47,0x84);
                auVar45 = pshufhw(auVar72,auVar72,0x84);
                auVar121 = pshufhw(auVar43,auVar97,0x84);
                auVar43 = (auVar121 | auVar45 & auVar43) ^ auVar74;
                auVar43 = packssdw(auVar43,auVar43);
                if ((auVar43 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  iVar14 = in_XMM14._12_2_;
                  if (s2_beg != 0) {
                    iVar14 = iVar13;
                  }
                  ptr_00[uVar29 + 8] = iVar14;
                }
                uVar29 = uVar29 + 8;
                iVar28 = iVar28 + gap * -8;
                uVar33 = uVar33 + gap * -8;
                iVar27 = iVar27 + gap * 8;
              } while ((s2Len + 7U & 0xfffffff8) != uVar29);
              alVar57 = (__m128i)psubsw((undefined1  [16])0x0,auVar67);
              palVar20 = ptr_03 + (uVar18 - 1);
              local_78 = auVar40._0_2_;
              uStack_76 = auVar40._2_2_;
              uVar29 = size;
              uVar92 = local_78;
              uVar98 = uStack_76;
              uVar99 = local_78;
              uVar100 = uStack_76;
              uVar101 = local_78;
              uVar103 = uStack_76;
              uVar104 = local_78;
              uVar105 = uStack_76;
              do {
                *palVar20 = alVar57;
                auVar40._4_4_ = uVar36;
                auVar40._0_4_ = uVar36;
                auVar40._8_4_ = uVar36;
                auVar40._12_4_ = uVar36;
                alVar57 = (__m128i)psubsw((undefined1  [16])alVar57,auVar40);
                sVar69 = (short)alVar57[0];
                uVar92 = (ushort)(sVar69 < (short)uVar92) * sVar69 |
                         (sVar69 >= (short)uVar92) * uVar92;
                sVar69 = alVar57[0]._2_2_;
                uVar98 = (ushort)(sVar69 < (short)uVar98) * sVar69 |
                         (sVar69 >= (short)uVar98) * uVar98;
                sVar69 = alVar57[0]._4_2_;
                uVar99 = (ushort)(sVar69 < (short)uVar99) * sVar69 |
                         (sVar69 >= (short)uVar99) * uVar99;
                sVar69 = alVar57[0]._6_2_;
                uVar100 = (ushort)(sVar69 < (short)uVar100) * sVar69 |
                          (sVar69 >= (short)uVar100) * uVar100;
                sVar69 = (short)alVar57[1];
                uVar101 = (ushort)(sVar69 < (short)uVar101) * sVar69 |
                          (sVar69 >= (short)uVar101) * uVar101;
                sVar69 = alVar57[1]._2_2_;
                uVar103 = (ushort)(sVar69 < (short)uVar103) * sVar69 |
                          (sVar69 >= (short)uVar103) * uVar103;
                sVar69 = alVar57[1]._4_2_;
                uVar104 = (ushort)(sVar69 < (short)uVar104) * sVar69 |
                          (sVar69 >= (short)uVar104) * uVar104;
                sVar69 = alVar57[1]._6_2_;
                uVar105 = (ushort)(sVar69 < (short)uVar105) * sVar69 |
                          (sVar69 >= (short)uVar105) * uVar105;
                palVar20 = palVar20 + -1;
                iVar27 = (int)uVar29;
                uVar32 = iVar27 - 1;
                uVar29 = (ulong)uVar32;
              } while (uVar32 != 0 && 0 < iVar27);
              palVar20 = ptr_02 + uVar9;
              lVar30 = size * uVar25;
              lVar24 = 0;
              local_88 = auVar41._0_2_;
              sStack_86 = auVar41._2_2_;
              auVar119._0_2_ = -(ushort)(local_88 == 7);
              auVar119._2_2_ = -(ushort)(sStack_86 == 6);
              auVar119._4_2_ = -(ushort)(local_88 == 5);
              auVar119._6_2_ = -(ushort)(sStack_86 == 4);
              auVar119._8_2_ = -(ushort)(local_88 == 3);
              auVar119._10_2_ = -(ushort)(sStack_86 == 2);
              auVar119._12_2_ = -(ushort)(local_88 == 1);
              auVar119._14_2_ = -(ushort)(sStack_86 == 0);
              auVar41._4_4_ = uVar37;
              auVar41._0_4_ = uVar37;
              auVar41._8_4_ = uVar37;
              auVar41._12_4_ = uVar37;
              uVar29 = 0;
              auVar58 = auVar41;
              auVar108 = auVar41;
              local_198 = iVar22;
              do {
                uVar1 = ptr_02[uVar18 - 1][0];
                auVar115._8_8_ = ptr_02[uVar18 - 1][1] << 0x10 | uVar1 >> 0x30;
                auVar115._0_8_ = uVar1 << 0x10 | (ulong)(ushort)ptr_00[uVar29];
                iVar27 = ppVar7->mapper[(byte)s2[uVar29]];
                auVar73 = psubsw(auVar41,(undefined1  [16])*ptr_03);
                lVar31 = 0;
                auVar40 = auVar41;
                do {
                  auVar77 = *(undefined1 (*) [16])((long)*ptr_02 + lVar31);
                  auVar107 = paddsw(auVar115,*(undefined1 (*) [16])
                                              ((long)pvVar6 + lVar31 + (long)iVar27 * size * 0x10));
                  auVar74 = paddsw(auVar73,*(undefined1 (*) [16])((long)*ptr_03 + lVar31));
                  auVar11._4_4_ = uVar36;
                  auVar11._0_4_ = uVar36;
                  auVar11._8_4_ = uVar36;
                  auVar11._12_4_ = uVar36;
                  auVar43 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar31),auVar11);
                  sVar69 = auVar74._0_2_;
                  sVar35 = auVar40._0_2_;
                  auVar83._0_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar74._2_2_;
                  sVar35 = auVar40._2_2_;
                  auVar83._2_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar74._4_2_;
                  sVar35 = auVar40._4_2_;
                  auVar83._4_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar74._6_2_;
                  sVar35 = auVar40._6_2_;
                  auVar83._6_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar74._8_2_;
                  sVar35 = auVar40._8_2_;
                  auVar83._8_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar74._10_2_;
                  sVar35 = auVar40._10_2_;
                  auVar83._10_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar74._12_2_;
                  sVar35 = auVar40._12_2_;
                  sVar55 = auVar40._14_2_;
                  auVar83._12_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar74._14_2_;
                  auVar83._14_2_ =
                       (ushort)(sVar55 < sVar69) * sVar69 | (ushort)(sVar55 >= sVar69) * sVar55;
                  auVar40 = psubsw(auVar77,auVar67);
                  sVar69 = auVar43._0_2_;
                  sVar35 = auVar40._0_2_;
                  uVar34 = (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar43._2_2_;
                  sVar35 = auVar40._2_2_;
                  uVar48 = (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar43._4_2_;
                  sVar35 = auVar40._4_2_;
                  uVar49 = (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar43._6_2_;
                  sVar35 = auVar40._6_2_;
                  uVar50 = (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar43._8_2_;
                  sVar35 = auVar40._8_2_;
                  uVar51 = (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar43._10_2_;
                  sVar35 = auVar40._10_2_;
                  uVar52 = (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar43._12_2_;
                  sVar35 = auVar40._12_2_;
                  sVar55 = auVar40._14_2_;
                  uVar53 = (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar43._14_2_;
                  uVar54 = (ushort)(sVar55 < sVar69) * sVar69 | (ushort)(sVar55 >= sVar69) * sVar55;
                  sVar69 = auVar107._0_2_;
                  uVar68 = (sVar69 < (short)uVar34) * uVar34 |
                           (ushort)(sVar69 >= (short)uVar34) * sVar69;
                  sVar69 = auVar107._2_2_;
                  uVar79 = (sVar69 < (short)uVar48) * uVar48 |
                           (ushort)(sVar69 >= (short)uVar48) * sVar69;
                  sVar69 = auVar107._4_2_;
                  uVar80 = (sVar69 < (short)uVar49) * uVar49 |
                           (ushort)(sVar69 >= (short)uVar49) * sVar69;
                  sVar69 = auVar107._6_2_;
                  uVar81 = (sVar69 < (short)uVar50) * uVar50 |
                           (ushort)(sVar69 >= (short)uVar50) * sVar69;
                  auVar73._0_8_ = CONCAT26(uVar81,CONCAT24(uVar80,CONCAT22(uVar79,uVar68)));
                  sVar69 = auVar107._8_2_;
                  auVar73._8_2_ =
                       (sVar69 < (short)uVar51) * uVar51 |
                       (ushort)(sVar69 >= (short)uVar51) * sVar69;
                  sVar69 = auVar107._10_2_;
                  auVar73._10_2_ =
                       (sVar69 < (short)uVar52) * uVar52 |
                       (ushort)(sVar69 >= (short)uVar52) * sVar69;
                  sVar69 = auVar107._12_2_;
                  sVar35 = auVar107._14_2_;
                  auVar73._12_2_ =
                       (sVar69 < (short)uVar53) * uVar53 |
                       (ushort)(sVar69 >= (short)uVar53) * sVar69;
                  auVar73._14_2_ =
                       (sVar35 < (short)uVar54) * uVar54 |
                       (ushort)(sVar35 >= (short)uVar54) * sVar35;
                  puVar3 = (ushort *)((long)*ptr + lVar31);
                  *puVar3 = uVar34;
                  puVar3[1] = uVar48;
                  puVar3[2] = uVar49;
                  puVar3[3] = uVar50;
                  puVar3[4] = uVar51;
                  puVar3[5] = uVar52;
                  puVar3[6] = uVar53;
                  puVar3[7] = uVar54;
                  *(undefined1 (*) [16])((long)*ptr_01 + lVar31) = auVar73;
                  lVar31 = lVar31 + 0x10;
                  auVar40 = auVar83;
                  auVar115 = auVar77;
                } while (size << 4 != lVar31);
                auVar75._8_8_ = auVar73._8_8_ << 0x10 | (ulong)uVar81;
                uVar1 = uVar29 + 1;
                uVar34 = ptr_00[uVar29 + 1];
                auVar75._0_8_ = auVar73._0_8_ << 0x10 | (ulong)uVar34;
                auVar40 = paddsw((undefined1  [16])*ptr_03,auVar75);
                sVar69 = auVar40._0_2_;
                auVar84._0_2_ =
                     (ushort)((short)auVar83._0_2_ < sVar69) * sVar69 |
                     ((short)auVar83._0_2_ >= sVar69) * auVar83._0_2_;
                sVar69 = auVar40._2_2_;
                auVar84._2_2_ =
                     (ushort)((short)auVar83._2_2_ < sVar69) * sVar69 |
                     ((short)auVar83._2_2_ >= sVar69) * auVar83._2_2_;
                sVar69 = auVar40._4_2_;
                auVar84._4_2_ =
                     (ushort)((short)auVar83._4_2_ < sVar69) * sVar69 |
                     ((short)auVar83._4_2_ >= sVar69) * auVar83._4_2_;
                sVar69 = auVar40._6_2_;
                auVar84._6_2_ =
                     (ushort)((short)auVar83._6_2_ < sVar69) * sVar69 |
                     ((short)auVar83._6_2_ >= sVar69) * auVar83._6_2_;
                sVar69 = auVar40._8_2_;
                auVar84._8_2_ =
                     (ushort)((short)auVar83._8_2_ < sVar69) * sVar69 |
                     ((short)auVar83._8_2_ >= sVar69) * auVar83._8_2_;
                sVar69 = auVar40._10_2_;
                auVar84._10_2_ =
                     (ushort)((short)auVar83._10_2_ < sVar69) * sVar69 |
                     ((short)auVar83._10_2_ >= sVar69) * auVar83._10_2_;
                sVar69 = auVar40._12_2_;
                auVar84._12_2_ =
                     (ushort)((short)auVar83._12_2_ < sVar69) * sVar69 |
                     ((short)auVar83._12_2_ >= sVar69) * auVar83._12_2_;
                sVar69 = auVar40._14_2_;
                auVar84._14_2_ =
                     (ushort)((short)auVar83._14_2_ < sVar69) * sVar69 |
                     ((short)auVar83._14_2_ >= sVar69) * auVar83._14_2_;
                iVar27 = 6;
                do {
                  auVar85._0_8_ = auVar84._0_8_ << 0x10;
                  auVar85._8_8_ = auVar84._8_8_ << 0x10 | auVar84._0_8_ >> 0x30;
                  auVar40 = paddsw(auVar85,auVar42);
                  sVar69 = auVar84._0_2_;
                  sVar82 = auVar40._0_2_;
                  sVar35 = auVar84._2_2_;
                  sVar89 = auVar40._2_2_;
                  sVar55 = auVar84._4_2_;
                  sVar90 = auVar40._4_2_;
                  sVar10 = auVar84._6_2_;
                  sVar91 = auVar40._6_2_;
                  uVar48 = (ushort)(sVar91 < sVar10) * sVar10 | (ushort)(sVar91 >= sVar10) * sVar91;
                  auVar86._0_8_ =
                       CONCAT26(uVar48,CONCAT24((ushort)(sVar90 < sVar55) * sVar55 |
                                                (ushort)(sVar90 >= sVar55) * sVar90,
                                                CONCAT22((ushort)(sVar89 < sVar35) * sVar35 |
                                                         (ushort)(sVar89 >= sVar35) * sVar89,
                                                         (ushort)(sVar82 < sVar69) * sVar69 |
                                                         (ushort)(sVar82 >= sVar69) * sVar82)));
                  sVar69 = auVar84._8_2_;
                  sVar35 = auVar40._8_2_;
                  auVar86._8_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar84._10_2_;
                  sVar35 = auVar40._10_2_;
                  auVar86._10_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar84._12_2_;
                  sVar35 = auVar40._12_2_;
                  sVar55 = auVar40._14_2_;
                  auVar86._12_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar84._14_2_;
                  auVar86._14_2_ =
                       (ushort)(sVar55 < sVar69) * sVar69 | (ushort)(sVar55 >= sVar69) * sVar55;
                  iVar27 = iVar27 + -1;
                  auVar84 = auVar86;
                } while (iVar27 != 0);
                auVar87._0_8_ = auVar86._0_8_ << 0x10;
                auVar87._8_8_ = auVar86._8_8_ << 0x10 | (ulong)uVar48;
                auVar88 = paddsw(auVar87,ZEXT416(uVar17 & 0xffff));
                sVar69 = auVar88._0_2_;
                auVar76._0_2_ =
                     (ushort)((short)uVar34 < sVar69) * sVar69 | ((short)uVar34 >= sVar69) * uVar34;
                sVar69 = auVar88._2_2_;
                auVar76._2_2_ =
                     (ushort)((short)uVar68 < sVar69) * sVar69 | ((short)uVar68 >= sVar69) * uVar68;
                sVar69 = auVar88._4_2_;
                auVar76._4_2_ =
                     (ushort)((short)uVar79 < sVar69) * sVar69 | ((short)uVar79 >= sVar69) * uVar79;
                sVar69 = auVar88._6_2_;
                auVar76._6_2_ =
                     (ushort)((short)uVar80 < sVar69) * sVar69 | ((short)uVar80 >= sVar69) * uVar80;
                sVar69 = auVar88._8_2_;
                auVar76._8_2_ =
                     (ushort)((short)uVar81 < sVar69) * sVar69 | ((short)uVar81 >= sVar69) * uVar81;
                sVar69 = auVar88._10_2_;
                auVar76._10_2_ =
                     (ushort)((short)auVar73._8_2_ < sVar69) * sVar69 |
                     ((short)auVar73._8_2_ >= sVar69) * auVar73._8_2_;
                sVar69 = auVar88._12_2_;
                auVar76._12_2_ =
                     (ushort)((short)auVar73._10_2_ < sVar69) * sVar69 |
                     ((short)auVar73._10_2_ >= sVar69) * auVar73._10_2_;
                sVar69 = auVar88._14_2_;
                auVar76._14_2_ =
                     (ushort)((short)auVar73._12_2_ < sVar69) * sVar69 |
                     ((short)auVar73._12_2_ >= sVar69) * auVar73._12_2_;
                lVar26 = 0;
                lVar31 = lVar24;
                auVar40 = auVar108;
                do {
                  auVar12._4_4_ = uVar36;
                  auVar12._0_4_ = uVar36;
                  auVar12._8_4_ = uVar36;
                  auVar12._12_4_ = uVar36;
                  auVar74 = psubsw(auVar88,auVar12);
                  auVar77 = psubsw(auVar76,auVar67);
                  sVar69 = auVar77._0_2_;
                  sVar35 = auVar74._0_2_;
                  auVar88._0_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar77._2_2_;
                  sVar35 = auVar74._2_2_;
                  auVar88._2_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar77._4_2_;
                  sVar35 = auVar74._4_2_;
                  auVar88._4_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar77._6_2_;
                  sVar35 = auVar74._6_2_;
                  auVar88._6_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar77._8_2_;
                  sVar35 = auVar74._8_2_;
                  auVar88._8_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar77._10_2_;
                  sVar35 = auVar74._10_2_;
                  auVar88._10_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar77._12_2_;
                  sVar35 = auVar74._12_2_;
                  sVar55 = auVar74._14_2_;
                  auVar88._12_2_ =
                       (ushort)(sVar35 < sVar69) * sVar69 | (ushort)(sVar35 >= sVar69) * sVar35;
                  sVar69 = auVar77._14_2_;
                  auVar88._14_2_ =
                       (ushort)(sVar55 < sVar69) * sVar69 | (ushort)(sVar55 >= sVar69) * sVar55;
                  psVar4 = (short *)((long)*ptr_01 + lVar26);
                  sVar69 = *psVar4;
                  sVar35 = psVar4[1];
                  sVar55 = psVar4[2];
                  sVar10 = psVar4[3];
                  sVar82 = psVar4[4];
                  sVar89 = psVar4[5];
                  sVar90 = psVar4[6];
                  sVar91 = psVar4[7];
                  auVar76._0_2_ =
                       (sVar69 < (short)auVar88._0_2_) * auVar88._0_2_ |
                       (ushort)(sVar69 >= (short)auVar88._0_2_) * sVar69;
                  auVar76._2_2_ =
                       (sVar35 < (short)auVar88._2_2_) * auVar88._2_2_ |
                       (ushort)(sVar35 >= (short)auVar88._2_2_) * sVar35;
                  auVar76._4_2_ =
                       (sVar55 < (short)auVar88._4_2_) * auVar88._4_2_ |
                       (ushort)(sVar55 >= (short)auVar88._4_2_) * sVar55;
                  auVar76._6_2_ =
                       (sVar10 < (short)auVar88._6_2_) * auVar88._6_2_ |
                       (ushort)(sVar10 >= (short)auVar88._6_2_) * sVar10;
                  auVar76._8_2_ =
                       (sVar82 < (short)auVar88._8_2_) * auVar88._8_2_ |
                       (ushort)(sVar82 >= (short)auVar88._8_2_) * sVar82;
                  auVar76._10_2_ =
                       (sVar89 < (short)auVar88._10_2_) * auVar88._10_2_ |
                       (ushort)(sVar89 >= (short)auVar88._10_2_) * sVar89;
                  auVar76._12_2_ =
                       (sVar90 < (short)auVar88._12_2_) * auVar88._12_2_ |
                       (ushort)(sVar90 >= (short)auVar88._12_2_) * sVar90;
                  auVar76._14_2_ =
                       (sVar91 < (short)auVar88._14_2_) * auVar88._14_2_ |
                       (ushort)(sVar91 >= (short)auVar88._14_2_) * sVar91;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar26) = auVar76;
                  piVar8 = ((ppVar19->field_4).rowcols)->score_row;
                  *(int *)((long)piVar8 + lVar31) = (int)(short)auVar76._0_2_;
                  *(int *)((long)piVar8 + lVar30 * 4 + lVar31) = (int)(short)auVar76._2_2_;
                  *(int *)((long)piVar8 + lVar30 * 8 + lVar31) = (int)(short)auVar76._4_2_;
                  *(int *)((long)piVar8 + lVar30 * 0xc + lVar31) = (int)(short)auVar76._6_2_;
                  *(int *)((long)piVar8 + lVar30 * 0x10 + lVar31) = (int)(short)auVar76._8_2_;
                  *(int *)((long)piVar8 + lVar30 * 0x14 + lVar31) = (int)(short)auVar76._10_2_;
                  *(int *)((long)piVar8 + lVar30 * 0x18 + lVar31) = (int)(short)auVar76._12_2_;
                  *(int *)((long)piVar8 + lVar30 * 0x1c + lVar31) = (int)(short)auVar76._14_2_;
                  uVar92 = ((short)auVar88._0_2_ < (short)uVar92) * auVar88._0_2_ |
                           ((short)auVar88._0_2_ >= (short)uVar92) * uVar92;
                  uVar98 = ((short)auVar88._2_2_ < (short)uVar98) * auVar88._2_2_ |
                           ((short)auVar88._2_2_ >= (short)uVar98) * uVar98;
                  uVar99 = ((short)auVar88._4_2_ < (short)uVar99) * auVar88._4_2_ |
                           ((short)auVar88._4_2_ >= (short)uVar99) * uVar99;
                  uVar100 = ((short)auVar88._6_2_ < (short)uVar100) * auVar88._6_2_ |
                            ((short)auVar88._6_2_ >= (short)uVar100) * uVar100;
                  uVar101 = ((short)auVar88._8_2_ < (short)uVar101) * auVar88._8_2_ |
                            ((short)auVar88._8_2_ >= (short)uVar101) * uVar101;
                  uVar103 = ((short)auVar88._10_2_ < (short)uVar103) * auVar88._10_2_ |
                            ((short)auVar88._10_2_ >= (short)uVar103) * uVar103;
                  uVar104 = ((short)auVar88._12_2_ < (short)uVar104) * auVar88._12_2_ |
                            ((short)auVar88._12_2_ >= (short)uVar104) * uVar104;
                  uVar105 = ((short)auVar88._14_2_ < (short)uVar105) * auVar88._14_2_ |
                            ((short)auVar88._14_2_ >= (short)uVar105) * uVar105;
                  uVar92 = ((short)auVar76._0_2_ < (short)uVar92) * auVar76._0_2_ |
                           ((short)auVar76._0_2_ >= (short)uVar92) * uVar92;
                  uVar98 = ((short)auVar76._2_2_ < (short)uVar98) * auVar76._2_2_ |
                           ((short)auVar76._2_2_ >= (short)uVar98) * uVar98;
                  uVar99 = ((short)auVar76._4_2_ < (short)uVar99) * auVar76._4_2_ |
                           ((short)auVar76._4_2_ >= (short)uVar99) * uVar99;
                  uVar100 = ((short)auVar76._6_2_ < (short)uVar100) * auVar76._6_2_ |
                            ((short)auVar76._6_2_ >= (short)uVar100) * uVar100;
                  uVar101 = ((short)auVar76._8_2_ < (short)uVar101) * auVar76._8_2_ |
                            ((short)auVar76._8_2_ >= (short)uVar101) * uVar101;
                  uVar103 = ((short)auVar76._10_2_ < (short)uVar103) * auVar76._10_2_ |
                            ((short)auVar76._10_2_ >= (short)uVar103) * uVar103;
                  uVar104 = ((short)auVar76._12_2_ < (short)uVar104) * auVar76._12_2_ |
                            ((short)auVar76._12_2_ >= (short)uVar104) * uVar104;
                  uVar105 = ((short)auVar76._14_2_ < (short)uVar105) * auVar76._14_2_ |
                            ((short)auVar76._14_2_ >= (short)uVar105) * uVar105;
                  sVar69 = auVar40._0_2_;
                  auVar108._0_2_ =
                       (sVar69 < (short)auVar76._0_2_) * auVar76._0_2_ |
                       (ushort)(sVar69 >= (short)auVar76._0_2_) * sVar69;
                  sVar69 = auVar40._2_2_;
                  auVar108._2_2_ =
                       (sVar69 < (short)auVar76._2_2_) * auVar76._2_2_ |
                       (ushort)(sVar69 >= (short)auVar76._2_2_) * sVar69;
                  sVar69 = auVar40._4_2_;
                  auVar108._4_2_ =
                       (sVar69 < (short)auVar76._4_2_) * auVar76._4_2_ |
                       (ushort)(sVar69 >= (short)auVar76._4_2_) * sVar69;
                  sVar69 = auVar40._6_2_;
                  auVar108._6_2_ =
                       (sVar69 < (short)auVar76._6_2_) * auVar76._6_2_ |
                       (ushort)(sVar69 >= (short)auVar76._6_2_) * sVar69;
                  sVar69 = auVar40._8_2_;
                  auVar108._8_2_ =
                       (sVar69 < (short)auVar76._8_2_) * auVar76._8_2_ |
                       (ushort)(sVar69 >= (short)auVar76._8_2_) * sVar69;
                  sVar69 = auVar40._10_2_;
                  auVar108._10_2_ =
                       (sVar69 < (short)auVar76._10_2_) * auVar76._10_2_ |
                       (ushort)(sVar69 >= (short)auVar76._10_2_) * sVar69;
                  sVar69 = auVar40._12_2_;
                  sVar35 = auVar40._14_2_;
                  auVar108._12_2_ =
                       (sVar69 < (short)auVar76._12_2_) * auVar76._12_2_ |
                       (ushort)(sVar69 >= (short)auVar76._12_2_) * sVar69;
                  auVar108._14_2_ =
                       (sVar35 < (short)auVar76._14_2_) * auVar76._14_2_ |
                       (ushort)(sVar35 >= (short)auVar76._14_2_) * sVar35;
                  lVar26 = lVar26 + 0x10;
                  lVar31 = lVar31 + uVar25 * 4;
                  auVar40 = auVar108;
                } while (size << 4 != lVar26);
                sVar69 = (short)(*palVar20)[0];
                sVar35 = *(short *)((long)*palVar20 + 2);
                sVar55 = *(short *)((long)*palVar20 + 4);
                sVar10 = *(short *)((long)*palVar20 + 6);
                sVar82 = (short)(*palVar20)[1];
                sVar89 = *(short *)((long)*palVar20 + 10);
                sVar90 = *(short *)((long)*palVar20 + 0xc);
                sVar91 = *(short *)((long)*palVar20 + 0xe);
                sVar56 = auVar58._0_2_;
                auVar78._0_2_ = -(ushort)(sVar56 < sVar69);
                sVar60 = auVar58._2_2_;
                auVar78._2_2_ = -(ushort)(sVar60 < sVar35);
                sVar61 = auVar58._4_2_;
                auVar78._4_2_ = -(ushort)(sVar61 < sVar55);
                sVar62 = auVar58._6_2_;
                auVar78._6_2_ = -(ushort)(sVar62 < sVar10);
                sVar63 = auVar58._8_2_;
                auVar78._8_2_ = -(ushort)(sVar63 < sVar82);
                sVar64 = auVar58._10_2_;
                auVar78._10_2_ = -(ushort)(sVar64 < sVar89);
                sVar65 = auVar58._12_2_;
                auVar78._12_2_ = -(ushort)(sVar65 < sVar90);
                sVar66 = auVar58._14_2_;
                auVar78._14_2_ = -(ushort)(sVar66 < sVar91);
                auVar78 = auVar78 & auVar119;
                local_138 = (int)uVar29;
                if ((((((((((((((((auVar78 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar78 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar78 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar78 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar78 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar78 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar78 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar78 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar78 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar78 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar78 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar78 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar78 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar78 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar78 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar78[0xf] < '\0') {
                  local_198 = local_138;
                }
                auVar58._0_2_ =
                     (ushort)(sVar56 < sVar69) * sVar69 | (ushort)(sVar56 >= sVar69) * sVar56;
                auVar58._2_2_ =
                     (ushort)(sVar60 < sVar35) * sVar35 | (ushort)(sVar60 >= sVar35) * sVar60;
                auVar58._4_2_ =
                     (ushort)(sVar61 < sVar55) * sVar55 | (ushort)(sVar61 >= sVar55) * sVar61;
                auVar58._6_2_ =
                     (ushort)(sVar62 < sVar10) * sVar10 | (ushort)(sVar62 >= sVar10) * sVar62;
                auVar58._8_2_ =
                     (ushort)(sVar63 < sVar82) * sVar82 | (ushort)(sVar63 >= sVar82) * sVar63;
                auVar58._10_2_ =
                     (ushort)(sVar64 < sVar89) * sVar89 | (ushort)(sVar64 >= sVar89) * sVar64;
                auVar58._12_2_ =
                     (ushort)(sVar65 < sVar90) * sVar90 | (ushort)(sVar65 >= sVar90) * sVar65;
                auVar58._14_2_ =
                     (ushort)(sVar66 < sVar91) * sVar91 | (ushort)(sVar66 >= sVar91) * sVar66;
                lVar24 = lVar24 + 4;
                uVar29 = uVar1;
              } while (uVar1 != uVar25);
              if (s2_end != 0) {
                if (iVar16 < 7) {
                  iVar27 = 0;
                  auVar40 = auVar58;
                  do {
                    auVar59._0_8_ = auVar40._0_8_ << 0x10;
                    auVar59._8_8_ = auVar40._8_8_ << 0x10 | auVar40._0_8_ >> 0x30;
                    auVar58._14_2_ = auVar40._12_2_;
                    iVar27 = iVar27 + 1;
                    auVar40 = auVar59;
                  } while (iVar27 < (int)uVar23);
                }
                uVar17 = (uint)auVar58._14_2_;
              }
              sVar69 = (short)uVar17;
              uVar32 = uVar15;
              if ((s1_end != 0) && ((uVar38 & 0x7ffffff8) != 0)) {
                uVar25 = 0;
                do {
                  uVar33 = ((uint)uVar25 & 7) * uVar18 + ((uint)(uVar25 >> 3) & 0x1fffffff);
                  if ((int)uVar33 < (int)uVar5) {
                    auVar58._14_2_ = *(ushort *)((long)*ptr_02 + uVar25 * 2);
                    if ((short)(ushort)uVar17 < (short)auVar58._14_2_) {
                      uVar17 = (uint)auVar58._14_2_;
                      uVar32 = uVar33;
                      local_198 = iVar22;
                    }
                    else {
                      if ((int)uVar32 <= (int)uVar33) {
                        uVar33 = uVar32;
                      }
                      if (local_198 != iVar22) {
                        uVar33 = uVar32;
                      }
                      if (auVar58._14_2_ == (ushort)uVar17) {
                        uVar32 = uVar33;
                      }
                    }
                  }
                  sVar69 = (short)uVar17;
                  uVar25 = uVar25 + 1;
                } while ((uVar18 & 0xfffffff) << 3 != (int)uVar25);
              }
              if (s2_end == 0 && s1_end == 0) {
                uVar25 = ptr_02[uVar9][1];
                if (iVar16 < 7) {
                  iVar27 = 0;
                  uVar38 = ptr_02[uVar9][0];
                  do {
                    uVar25 = uVar25 << 0x10 | uVar38 >> 0x30;
                    iVar27 = iVar27 + 1;
                    uVar38 = uVar38 << 0x10;
                  } while (iVar27 < (int)uVar23);
                }
                sVar69 = (short)(uVar25 >> 0x30);
                uVar32 = uVar15;
                local_198 = iVar22;
              }
              sVar35 = auVar39._0_2_;
              auVar117._0_2_ = -(ushort)((short)uVar92 < sVar35);
              sVar55 = auVar39._2_2_;
              auVar117._2_2_ = -(ushort)((short)uVar98 < sVar55);
              auVar117._4_2_ = -(ushort)((short)uVar99 < sVar35);
              auVar117._6_2_ = -(ushort)((short)uVar100 < sVar55);
              auVar117._8_2_ = -(ushort)((short)uVar101 < sVar35);
              auVar117._10_2_ = -(ushort)((short)uVar103 < sVar55);
              auVar117._12_2_ = -(ushort)((short)uVar104 < sVar35);
              auVar117._14_2_ = -(ushort)((short)uVar105 < sVar55);
              auVar109._0_2_ = -(ushort)((short)local_78 < (short)auVar108._0_2_);
              auVar109._2_2_ = -(ushort)((short)uStack_76 < (short)auVar108._2_2_);
              auVar109._4_2_ = -(ushort)((short)local_78 < (short)auVar108._4_2_);
              auVar109._6_2_ = -(ushort)((short)uStack_76 < (short)auVar108._6_2_);
              auVar109._8_2_ = -(ushort)((short)local_78 < (short)auVar108._8_2_);
              auVar109._10_2_ = -(ushort)((short)uStack_76 < (short)auVar108._10_2_);
              auVar109._12_2_ = -(ushort)((short)local_78 < (short)auVar108._12_2_);
              auVar109._14_2_ = -(ushort)((short)uStack_76 < (short)auVar108._14_2_);
              auVar109 = auVar109 | auVar117;
              if ((((((((((((((((auVar109 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar109 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar109 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                              ) || (auVar109 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                            (auVar109 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar109 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar109 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar109 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar109 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar109 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar109 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar109 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar109 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar109 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar109 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar109[0xf] < '\0') {
                *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
                sVar69 = 0;
                local_198 = 0;
                uVar32 = 0;
              }
              ppVar19->score = (int)sVar69;
              ppVar19->end_query = uVar32;
              ppVar19->end_ref = local_198;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar19;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}